

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_CutPerformDerive07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  uint uVar1;
  uint uVar2;
  word t_00;
  word local_68;
  word t_2 [2];
  word z_2;
  word t_1;
  word z_1;
  word t;
  word z;
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  If_Man_t *p_local;
  
  if (nLeaves < 5) {
    p_local = (If_Man_t *)0x1;
  }
  else if (nLeaves == 5) {
    uVar1 = *pTruth;
    uVar2 = *pTruth;
    p_local = (If_Man_t *)If_Dec5Perform(CONCAT44(uVar1,uVar2),1);
    If_Dec6Verify(CONCAT44(uVar1,uVar2),(word)p_local);
  }
  else if (nLeaves == 6) {
    t_00 = *(word *)pTruth;
    p_local = (If_Man_t *)If_Dec6Perform(t_00,1);
    If_Dec6Verify(t_00,(word)p_local);
  }
  else {
    if (nLeaves != 7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                    ,0x420,
                    "word If_CutPerformDerive07(If_Man_t *, unsigned int *, int, int, char *)");
    }
    local_68 = *(word *)pTruth;
    t_2[0] = *(word *)(pTruth + 2);
    t_2[1] = If_Dec7Perform(&local_68,1);
    If_Dec7Verify(&local_68,t_2[1]);
    p_local = (If_Man_t *)t_2[1];
  }
  return (word)p_local;
}

Assistant:

word If_CutPerformDerive07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, 1 );
        If_Dec6Verify( t, z );
        return z;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, 1 );
        If_Dec6Verify( t, z );
        return z;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
        z = If_Dec7Perform( t, 1 );
        If_Dec7Verify( t, z );
        return z;
    }
    assert( 0 );
    return 0;
}